

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermIterators.hpp
# Opt level: O3

void __thiscall
Kernel::NonVariableIterator::NonVariableIterator
          (NonVariableIterator *this,Term *term,bool includeSelf)

{
  Term ***pppTVar1;
  size_t sVar2;
  Term **ppTVar3;
  
  (this->super_IteratorCore<Kernel::TermList>)._refCnt = 0;
  (this->super_IteratorCore<Kernel::TermList>)._vptr_IteratorCore =
       (_func_int **)&PTR__NonVariableIterator_00b3db38;
  (this->_stack)._capacity = 8;
  ppTVar3 = (Term **)Lib::FixedSizeAllocator<64UL>::alloc
                               ((FixedSizeAllocator<64UL> *)
                                (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  (this->_stack)._stack = ppTVar3;
  sVar2 = (this->_stack)._capacity;
  (this->_stack)._cursor = ppTVar3;
  (this->_stack)._end = ppTVar3 + sVar2;
  this->_added = 0;
  if (sVar2 == 0) {
    Lib::Stack<Kernel::Term_*>::expand(&this->_stack);
    ppTVar3 = (this->_stack)._cursor;
  }
  *ppTVar3 = term;
  pppTVar1 = &(this->_stack)._cursor;
  *pppTVar1 = *pppTVar1 + 1;
  if (!includeSelf) {
    next(this);
  }
  return;
}

Assistant:

NonVariableIterator(Term* term,bool includeSelf=false)
  : _stack(8),
    _added(0)
  {
    _stack.push(term);
    if (!includeSelf) {
      NonVariableIterator::next();
    }
  }